

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,long,duckdb::UnaryOperatorWrapper,duckdb::BitStringLenOperator>
               (string_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  idx_t extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar6;
  idx_t iVar7;
  char **ppcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bitstring_t bits;
  bitstring_t bits_00;
  bitstring_t bits_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar8 = &(ldata->value).pointer.ptr;
    iVar3 = count;
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      bits.value.pointer.ptr = (char *)iVar3;
      bits.value._0_8_ = *ppcVar8;
      iVar3 = Bit::BitLength(*(Bit **)(ppcVar8 + -1),bits);
      result_data[iVar7] = iVar3;
      ppcVar8 = ppcVar8 + 2;
      iVar3 = extraout_RDX_00;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      uVar6 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      uVar6 = extraout_RDX_01;
    }
    uVar10 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar11 = count;
        }
LAB_0185c3a2:
        ppcVar8 = &ldata[uVar10].value.pointer.ptr;
        for (; uVar4 = uVar10, uVar10 < uVar11; uVar10 = uVar10 + 1) {
          bits_00.value.pointer.ptr = (char *)uVar6;
          bits_00.value._0_8_ = *ppcVar8;
          iVar3 = Bit::BitLength(*(Bit **)(ppcVar8 + -1),bits_00);
          result_data[uVar10] = iVar3;
          ppcVar8 = ppcVar8 + 2;
          uVar6 = extraout_RDX_02;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar11 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar11 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0185c3a2;
        uVar4 = uVar11;
        if (uVar2 != 0) {
          ppcVar8 = &ldata[uVar10].value.pointer.ptr;
          for (uVar9 = 0; uVar4 = uVar10 + uVar9, uVar10 + uVar9 < uVar11; uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              bits_01.value.pointer.ptr = (char *)uVar6;
              bits_01.value._0_8_ = *ppcVar8;
              iVar3 = Bit::BitLength(*(Bit **)(ppcVar8 + -1),bits_01);
              result_data[uVar10 + uVar9] = iVar3;
              uVar6 = extraout_RDX_03;
            }
            ppcVar8 = ppcVar8 + 2;
          }
        }
      }
      uVar10 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}